

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::XmlReporter(XmlReporter *this,ReporterConfig *config)

{
  XmlWriter *in_RDI;
  ReporterConfig *in_stack_ffffffffffffffc8;
  
  SharedImpl<Catch::IReporter>::SharedImpl((SharedImpl<Catch::IReporter> *)in_RDI);
  *(undefined ***)in_RDI = &PTR__XmlReporter_0021eee0;
  ReporterConfig::ReporterConfig((ReporterConfig *)in_RDI,in_stack_ffffffffffffffc8);
  XmlWriter::XmlWriter(in_RDI);
  return;
}

Assistant:

XmlReporter( ReporterConfig const& config ) : m_config( config ) {}